

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_PartiteGraph.cpp
# Opt level: O2

void __thiscall
PartiteGraphTest_test_get_partition_of_vertex_Test::TestBody
          (PartiteGraphTest_test_get_partition_of_vertex_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  AssertionResult gtest_ar;
  int local_b4;
  PartiteGraph<int,_Vertex,_Edge> graph;
  
  ::graph::PartiteGraph<int,_Vertex,_Edge>::PartiteGraph(&graph);
  local_e8.ptr_._0_4_ = 0;
  std::__cxx11::string::string((string *)&gtest_ar,"0",(allocator *)&local_e0);
  std::
  _Hashtable<int,std::pair<int_const,Vertex>,std::allocator<std::pair<int_const,Vertex>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<int_const&,Vertex_const&>
            ((_Hashtable<int,std::pair<int_const,Vertex>,std::allocator<std::pair<int_const,Vertex>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&graph._partition,&local_e8,&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_e8.ptr_._0_4_ = 1;
  std::__cxx11::string::string((string *)&gtest_ar,"1",(allocator *)&local_e0);
  std::
  _Hashtable<int,std::pair<int_const,Vertex>,std::allocator<std::pair<int_const,Vertex>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<int_const&,Vertex_const&>
            ((_Hashtable<int,std::pair<int_const,Vertex>,std::allocator<std::pair<int_const,Vertex>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&graph._partition,&local_e8,&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  local_e8.ptr_._0_4_ = 0x3f800000;
  std::
  _Hashtable<int,std::pair<int_const,Edge>,std::allocator<std::pair<int_const,Edge>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<int_const&,Edge_const&>
            ((_Hashtable<int,std::pair<int_const,Edge>,std::allocator<std::pair<int_const,Edge>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&graph.super_PartiteGraph<int,_Edge>._partition,&gtest_ar);
  local_e0.data_._0_4_ = 0;
  local_e8.ptr_._0_4_ =
       ::graph::PartiteGraph<int,_Vertex,_Edge>::get_vertex_partition(&graph,(int *)&local_e0,0);
  local_b4 = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"graph.get_vertex_partition(0)","0",(uint *)&local_e8,&local_b4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/childsish[P]graph/tests/test_PartiteGraph.cpp"
               ,0x28,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0.data_._0_4_ = 1;
  local_e8.ptr_._0_4_ =
       ::graph::PartiteGraph<int,_Vertex,_Edge>::get_vertex_partition(&graph,(int *)&local_e0,0);
  local_b4 = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"graph.get_vertex_partition(1)","0",(uint *)&local_e8,&local_b4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/childsish[P]graph/tests/test_PartiteGraph.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0.data_._0_4_ = 2;
  local_e8.ptr_._0_4_ =
       ::graph::PartiteGraph<int,_Vertex,_Edge>::get_vertex_partition(&graph,(int *)&local_e0,0);
  local_b4 = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"graph.get_vertex_partition(2)","1",(uint *)&local_e8,&local_b4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/childsish[P]graph/tests/test_PartiteGraph.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ::graph::PartiteGraph<int,_Vertex,_Edge>::~PartiteGraph(&graph);
  return;
}

Assistant:

TEST(PartiteGraphTest, test_get_partition_of_vertex) {
    graph::PartiteGraph<int, Vertex, Edge> graph;
    graph.add_vertex<vertex_partition>(0, {"0"});
    graph.add_vertex<vertex_partition>(1, {"1"});
    graph.add_vertex<edge_partition>(2, {1.0});

    EXPECT_EQ(graph.get_vertex_partition(0), 0);
    EXPECT_EQ(graph.get_vertex_partition(1), 0);
    EXPECT_EQ(graph.get_vertex_partition(2), 1);
}